

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maplayers.cpp
# Opt level: O0

void __thiscall CMapLayers::LoadBackgroundMap(CMapLayers *this)

{
  long lVar1;
  long *plVar2;
  int iVar3;
  uint uVar4;
  CConfig *pCVar5;
  IStorage *pIVar6;
  ulong uVar7;
  IConsole *pIVar8;
  long in_RDI;
  char *pcVar9;
  long in_FS_OFFSET;
  bool IsDaytime;
  int HourOfTheDay;
  char *pMenuMap;
  char aBuf [128];
  char *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  IMap *pMap;
  IMap *in_stack_ffffffffffffff18;
  CMapImages *in_stack_ffffffffffffff20;
  array<CEnvPoint,_allocator_default<CEnvPoint>_> *in_stack_ffffffffffffff30;
  CLayers *pLayers;
  CMapLayers *this_00;
  char *local_98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar5 = CComponent::Config((CComponent *)0x16f050);
  local_98 = pCVar5->m_ClMenuMap;
  iVar3 = str_comp(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (iVar3 == 0) {
    iVar3 = time_season();
    switch(iVar3) {
    case 0:
      local_98 = "heavens";
      break;
    case 1:
      local_98 = "jungle";
      break;
    case 2:
      local_98 = "autumn";
      break;
    case 3:
      local_98 = "winter";
    }
  }
  iVar3 = time_houroftheday();
  pcVar9 = "night";
  if (5 < iVar3 && iVar3 < 0x12) {
    pcVar9 = "day";
  }
  str_format(&stack0xffffffffffffff78,0x80,"ui/themes/%s_%s.map",local_98,pcVar9);
  pLayers = *(CLayers **)(in_RDI + 0x18);
  this_00 = (CMapLayers *)&stack0xffffffffffffff78;
  pIVar6 = CGameClient::Storage(*(CGameClient **)(in_RDI + 8));
  uVar7 = (**(code **)(*(long *)pLayers + 0x48))(pLayers,this_00,pIVar6);
  if ((uVar7 & 1) == 0) {
    str_format(&stack0xffffffffffffff78,0x80,"ui/themes/%s.map",local_98);
    plVar2 = *(long **)(in_RDI + 0x18);
    in_stack_ffffffffffffff30 =
         (array<CEnvPoint,_allocator_default<CEnvPoint>_> *)&stack0xffffffffffffff78;
    pIVar6 = CGameClient::Storage(*(CGameClient **)(in_RDI + 8));
    uVar7 = (**(code **)(*plVar2 + 0x48))(plVar2,in_stack_ffffffffffffff30,pIVar6);
    if ((uVar7 & 1) == 0) {
      pcVar9 = "day";
      if (5 < iVar3 && iVar3 < 0x12) {
        pcVar9 = "night";
      }
      str_format(&stack0xffffffffffffff78,0x80,"ui/themes/%s_%s.map",local_98,pcVar9);
      in_stack_ffffffffffffff18 = *(IMap **)(in_RDI + 0x18);
      in_stack_ffffffffffffff20 = (CMapImages *)&stack0xffffffffffffff78;
      pIVar6 = CGameClient::Storage(*(CGameClient **)(in_RDI + 8));
      uVar4 = (*(in_stack_ffffffffffffff18->super_IInterface)._vptr_IInterface[9])
                        (in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,pIVar6);
      if ((uVar4 & 1) == 0) {
        str_format(&stack0xffffffffffffff78,0x80,"map \'%s\' not found",local_98);
        pIVar8 = CComponent::Console((CComponent *)0x16f25c);
        (*(pIVar8->super_IInterface)._vptr_IInterface[0x19])
                  (pIVar8,1,"client",&stack0xffffffffffffff78,0);
        goto LAB_0016f323;
      }
    }
  }
  str_format(&stack0xffffffffffffff78,0x80,"loaded map \'%s\'",local_98);
  pIVar8 = CComponent::Console((CComponent *)0x16f2ac);
  (*(pIVar8->super_IInterface)._vptr_IInterface[0x19])(pIVar8,1,"client",&stack0xffffffffffffff78,0)
  ;
  pMap = *(IMap **)(in_RDI + 0x10);
  CComponent::Kernel((CComponent *)0x16f2df);
  CLayers::Init((CLayers *)in_stack_ffffffffffffff20,(IKernel *)in_stack_ffffffffffffff18,pMap);
  CMapImages::OnMenuMapLoad(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  LoadEnvPoints(this_00,pLayers,in_stack_ffffffffffffff30);
LAB_0016f323:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CMapLayers::LoadBackgroundMap()
{
	const char *pMenuMap = Config()->m_ClMenuMap;
	if(str_comp(pMenuMap, "auto") == 0)
	{
		switch(time_season())
		{
			case SEASON_SPRING:
				pMenuMap = "heavens";
				break;
			case SEASON_SUMMER:
				pMenuMap = "jungle";
				break;
			case SEASON_AUTUMN:
				pMenuMap = "autumn";
				break;
			case SEASON_WINTER:
				pMenuMap = "winter";
				break;
		}
	}

	const int HourOfTheDay = time_houroftheday();
	const bool IsDaytime = HourOfTheDay >= 6 && HourOfTheDay < 18;

	char aBuf[128];
	// check for the appropriate day/night map
	str_format(aBuf, sizeof(aBuf), "ui/themes/%s_%s.map", pMenuMap, IsDaytime ? "day" : "night");
	if(!m_pMenuMap->Load(aBuf, m_pClient->Storage()))
	{
		// fall back on generic map
		str_format(aBuf, sizeof(aBuf), "ui/themes/%s.map", pMenuMap);
		if(!m_pMenuMap->Load(aBuf, m_pClient->Storage()))
		{
			// fall back on day/night alternative map
			str_format(aBuf, sizeof(aBuf), "ui/themes/%s_%s.map", pMenuMap, IsDaytime ? "night" : "day");
			if(!m_pMenuMap->Load(aBuf, m_pClient->Storage()))
			{
				str_format(aBuf, sizeof(aBuf), "map '%s' not found", pMenuMap);
				Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", aBuf);
				return;
			}
		}
	}

	str_format(aBuf, sizeof(aBuf), "loaded map '%s'", pMenuMap);
	Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", aBuf);

	m_pMenuLayers->Init(Kernel(), m_pMenuMap);
	m_pClient->m_pMapimages->OnMenuMapLoad(m_pMenuMap);
	LoadEnvPoints(m_pMenuLayers, m_lEnvPointsMenu);
}